

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O2

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
CompatibleTypes<proto2_unittest::TestAllTypes>::TestBody
          (CompatibleTypes<proto2_unittest::TestAllTypes> *this)

{
  bool bVar1;
  pointer *__ptr;
  InternalMetadata *pIVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar3;
  char *pcVar4;
  char *in_R9;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  AssertHelper local_118;
  AssertionResult gtest_ar__3;
  Uint32Message msg5;
  AssertionResult gtest_ar__2;
  Int32Message msg4;
  AssertHelper local_a0;
  Uint64Message msg3;
  string serialized;
  BoolMessage msg2;
  Int64Message msg1;
  
  proto2_unittest::Int64Message::Int64Message(&msg1);
  msg1.field_0._impl_.data_ = 0x100000000;
  msg1.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       msg1.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  serialized._M_dataplus._M_p = (pointer)&serialized.field_2;
  serialized._M_string_length = 0;
  serialized.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&msg1,&serialized);
  proto2_unittest::BoolMessage::BoolMessage(&msg2);
  data._M_str = serialized._M_dataplus._M_p;
  data._M_len = serialized._M_string_length;
  msg4.super_Message.super_MessageLite._vptr_MessageLite._0_1_ =
       MessageLite::ParseFromString((MessageLite *)&msg2,data);
  pIVar2 = &msg4.super_Message.super_MessageLite._internal_metadata_;
  msg4.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
  if ((bool)(char)msg4.super_Message.super_MessageLite._vptr_MessageLite) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pIVar2);
    msg4.super_Message.super_MessageLite._vptr_MessageLite._0_1_ = '\x01';
    msg5.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)
         CONCAT71(msg5.super_Message.super_MessageLite._vptr_MessageLite._1_7_,
                  msg2.field_0._impl_.data_);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&msg3,"static_cast<bool>(data)","msg2.data()",(bool *)&msg4,(bool *)&msg5
              );
    if ((char)msg3.super_Message.super_MessageLite._vptr_MessageLite != '\0') {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&msg3.super_Message.super_MessageLite._internal_metadata_);
      proto2_unittest::Uint64Message::Uint64Message(&msg3);
      data_00._M_str = serialized._M_dataplus._M_p;
      data_00._M_len = serialized._M_string_length;
      bVar1 = MessageLite::ParseFromString((MessageLite *)&msg3,data_00);
      pIVar2 = &msg5.super_Message.super_MessageLite._internal_metadata_;
      msg5.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)
           CONCAT71(msg5.super_Message.super_MessageLite._vptr_MessageLite._1_7_,bVar1);
      msg5.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
      if (bVar1) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pIVar2);
        msg5.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)&DAT_100000000;
        gtest_ar__2._0_8_ = msg3.field_0._impl_.data_;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&msg4,"static_cast<uint64_t>(data)","msg3.data()",
                   (unsigned_long *)&msg5,(unsigned_long *)&gtest_ar__2);
        if ((char)msg4.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
          testing::Message::Message((Message *)&msg5);
          if (msg4.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
            pcVar4 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar4 = *(char **)msg4.super_Message.super_MessageLite._internal_metadata_.ptr_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__2,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                     ,0x438,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&msg5);
          pIVar2 = &msg4.super_Message.super_MessageLite._internal_metadata_;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
          if (msg5.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
            (**(code **)(*msg5.super_Message.super_MessageLite._vptr_MessageLite + 8))();
          }
          goto LAB_007dcc2c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&msg4.super_Message.super_MessageLite._internal_metadata_);
        proto2_unittest::Int32Message::Int32Message(&msg4);
        data_01._M_str = serialized._M_dataplus._M_p;
        data_01._M_len = serialized._M_string_length;
        bVar1 = MessageLite::ParseFromString((MessageLite *)&msg4,data_01);
        puVar3 = &gtest_ar__2.message_;
        gtest_ar__2.success_ = bVar1;
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (bVar1) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(puVar3);
          gtest_ar__2._0_8_ = gtest_ar__2._0_8_ & 0xffffffff00000000;
          gtest_ar__3._0_4_ = msg4.field_0._impl_.data_;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&msg5,"static_cast<int32_t>(data)","msg4.data()",
                     (int *)&gtest_ar__2,(int *)&gtest_ar__3);
          if ((char)msg5.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
            testing::Message::Message((Message *)&gtest_ar__2);
            if (msg5.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
              pcVar4 = anon_var_dwarf_651463 + 5;
            }
            else {
              pcVar4 = *(char **)msg5.super_Message.super_MessageLite._internal_metadata_.ptr_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__3,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                       ,0x43d,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar__2);
            puVar3 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&msg5.super_Message.super_MessageLite._internal_metadata_;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
            if (gtest_ar__2._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
            }
            goto LAB_007dcd29;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&msg5.super_Message.super_MessageLite._internal_metadata_);
          proto2_unittest::Uint32Message::Uint32Message(&msg5);
          data_02._M_str = serialized._M_dataplus._M_p;
          data_02._M_len = serialized._M_string_length;
          bVar1 = MessageLite::ParseFromString((MessageLite *)&msg5,data_02);
          puVar3 = &gtest_ar__3.message_;
          gtest_ar__3.success_ = bVar1;
          gtest_ar__3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (bVar1) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(puVar3);
            gtest_ar__3.success_ = false;
            gtest_ar__3._1_3_ = 0;
            local_118.data_._0_4_ = msg5.field_0._impl_.data_;
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                      ((internal *)&gtest_ar__2,"static_cast<uint32_t>(data)","msg5.data()",
                       (uint *)&gtest_ar__3,(uint *)&local_118);
            if (gtest_ar__2.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar__3);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar__2.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar4 = anon_var_dwarf_651463 + 5;
              }
              else {
                pcVar4 = *(char **)gtest_ar__2.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_118,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                         ,0x442,pcVar4);
              testing::internal::AssertHelper::operator=(&local_118,(Message *)&gtest_ar__3);
              testing::internal::AssertHelper::~AssertHelper(&local_118);
              if ((long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) + 8))();
              }
            }
            puVar3 = &gtest_ar__2.message_;
          }
          else {
            testing::Message::Message((Message *)&local_118);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__2,(internal *)&gtest_ar__3,
                       (AssertionResult *)"msg5.ParseFromString(serialized)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                       ,0x441,(char *)gtest_ar__2._0_8_);
            testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_118);
            testing::internal::AssertHelper::~AssertHelper(&local_a0);
            std::__cxx11::string::~string((string *)&gtest_ar__2);
            if ((long *)CONCAT44(local_118.data_._4_4_,(uint32_t)local_118.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_118.data_._4_4_,(uint32_t)local_118.data_) + 8))
                        ();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(puVar3);
          proto2_unittest::Uint32Message::~Uint32Message(&msg5);
        }
        else {
          testing::Message::Message((Message *)&gtest_ar__3);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&msg5,(internal *)&gtest_ar__2,
                     (AssertionResult *)"msg4.ParseFromString(serialized)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_118,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                     ,0x43c,(char *)msg5.super_Message.super_MessageLite._vptr_MessageLite);
          testing::internal::AssertHelper::operator=(&local_118,(Message *)&gtest_ar__3);
          testing::internal::AssertHelper::~AssertHelper(&local_118);
          std::__cxx11::string::~string((string *)&msg5);
          if ((long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) + 8))();
          }
LAB_007dcd29:
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(puVar3);
        }
        proto2_unittest::Int32Message::~Int32Message(&msg4);
      }
      else {
        testing::Message::Message((Message *)&gtest_ar__2);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&msg4,(internal *)&msg5,
                   (AssertionResult *)"msg3.ParseFromString(serialized)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__3,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                   ,0x437,(char *)CONCAT71(msg4.super_Message.super_MessageLite._vptr_MessageLite.
                                           _1_7_,(char)msg4.super_Message.super_MessageLite.
                                                       _vptr_MessageLite));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
        std::__cxx11::string::~string((string *)&msg4);
        if (gtest_ar__2._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
        }
LAB_007dcc2c:
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pIVar2);
      }
      proto2_unittest::Uint64Message::~Uint64Message(&msg3);
      goto LAB_007dcd9e;
    }
    testing::Message::Message((Message *)&msg4);
    if (msg3.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)msg3.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&msg5,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x433,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&msg5,(Message *)&msg4);
    pIVar2 = &msg3.super_Message.super_MessageLite._internal_metadata_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&msg5);
    if ((long *)CONCAT71(msg4.super_Message.super_MessageLite._vptr_MessageLite._1_7_,
                         (char)msg4.super_Message.super_MessageLite._vptr_MessageLite) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(msg4.super_Message.super_MessageLite._vptr_MessageLite._1_7_,
                                     (char)msg4.super_Message.super_MessageLite._vptr_MessageLite) +
                  8))();
    }
  }
  else {
    testing::Message::Message((Message *)&msg5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&msg3,(internal *)&msg4,
               (AssertionResult *)"msg2.ParseFromString(serialized)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x432,(char *)CONCAT71(msg3.super_Message.super_MessageLite._vptr_MessageLite._1_7_,
                                       (char)msg3.super_Message.super_MessageLite._vptr_MessageLite)
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&msg5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)&msg3);
    if (msg5.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*msg5.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)pIVar2);
LAB_007dcd9e:
  proto2_unittest::BoolMessage::~BoolMessage(&msg2);
  std::__cxx11::string::~string((string *)&serialized);
  proto2_unittest::Int64Message::~Int64Message(&msg1);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, CompatibleTypes) {
  const int64_t data = 0x100000000LL;
  typename TestFixture::Int64Message msg1;
  msg1.set_data(data);
  std::string serialized;
  msg1.SerializeToString(&serialized);

  // Test int64 is compatible with bool
  typename TestFixture::BoolMessage msg2;
  ASSERT_TRUE(msg2.ParseFromString(serialized));
  ASSERT_EQ(static_cast<bool>(data), msg2.data());

  // Test int64 is compatible with uint64
  typename TestFixture::Uint64Message msg3;
  ASSERT_TRUE(msg3.ParseFromString(serialized));
  ASSERT_EQ(static_cast<uint64_t>(data), msg3.data());

  // Test int64 is compatible with int32
  typename TestFixture::Int32Message msg4;
  ASSERT_TRUE(msg4.ParseFromString(serialized));
  ASSERT_EQ(static_cast<int32_t>(data), msg4.data());

  // Test int64 is compatible with uint32
  typename TestFixture::Uint32Message msg5;
  ASSERT_TRUE(msg5.ParseFromString(serialized));
  ASSERT_EQ(static_cast<uint32_t>(data), msg5.data());
}